

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  bool bVar1;
  LogMessage *other;
  string *value;
  MessageOptions *this_00;
  MessageOptions *from_00;
  UnknownFieldSet *this_01;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  DescriptorProto *local_18;
  DescriptorProto *from_local;
  DescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x8f0);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&this->field_,&local_18->field_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom
            (&this->extension_,&local_18->extension_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom
            (&this->nested_type_,&local_18->nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom
            (&this->enum_type_,&local_18->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::MergeFrom
            (&this->extension_range_,&local_18->extension_range_);
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      value = name_abi_cxx11_(local_18);
      set_name(this,value);
    }
    bVar1 = has_options(local_18);
    if (bVar1) {
      this_00 = mutable_options(this);
      from_00 = options(local_18);
      MessageOptions::MergeFrom(this_00,from_00);
    }
  }
  this_01 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_01,other_00);
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  field_.MergeFrom(from.field_);
  extension_.MergeFrom(from.extension_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MessageOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}